

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::ReaderMgr::getLastExtEntityInfo(ReaderMgr *this,LastExtEntityInfo *lastInfo)

{
  XMLReader *this_00;
  _func_int **pp_Var1;
  XMLCh *pXVar2;
  XMLFileLoc XVar3;
  XMLReader *theReader;
  XMLEntityDecl *theEntity;
  LastExtEntityInfo *lastInfo_local;
  ReaderMgr *this_local;
  
  if ((this->fReaderStack == (RefStackOf<xercesc_4_0::ReaderMgr::ReaderData> *)0x0) ||
     (this->fCurReader == (XMLReader *)0x0)) {
    lastInfo->systemId = L"";
    lastInfo->publicId = L"";
    lastInfo->lineNumber = 0;
    lastInfo->colNumber = 0;
  }
  else {
    theEntity = (XMLEntityDecl *)lastInfo;
    lastInfo_local = (LastExtEntityInfo *)this;
    this_00 = getLastExtEntity(this,(XMLEntityDecl **)&theReader);
    pp_Var1 = (_func_int **)XMLReader::getSystemId(this_00);
    (theEntity->super_XSerializable)._vptr_XSerializable = pp_Var1;
    pXVar2 = XMLReader::getPublicId(this_00);
    theEntity->fId = (XMLSize_t)pXVar2;
    XVar3 = XMLReader::getLineNumber(this_00);
    theEntity->fValueLen = XVar3;
    pXVar2 = (XMLCh *)XMLReader::getColumnNumber(this_00);
    theEntity->fValue = pXVar2;
  }
  return;
}

Assistant:

void ReaderMgr::getLastExtEntityInfo(LastExtEntityInfo& lastInfo) const
{
    //
    //  If the reader stack never got created or we've not managed to open any
    //  main entity yet, then we can't give this information.
    //
    if (!fReaderStack || !fCurReader)
    {
        lastInfo.systemId = XMLUni::fgZeroLenString;
        lastInfo.publicId = XMLUni::fgZeroLenString;
        lastInfo.lineNumber = 0;
        lastInfo.colNumber = 0;
        return;
    }

    // We have at least one entity so get the data
    const XMLEntityDecl*    theEntity;
    const XMLReader*        theReader = getLastExtEntity(theEntity);

    // Fill in the info structure with the reader we found
    lastInfo.systemId = theReader->getSystemId();
    lastInfo.publicId = theReader->getPublicId();
    lastInfo.lineNumber = theReader->getLineNumber();
    lastInfo.colNumber = theReader->getColumnNumber();
}